

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::RangeSelectSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != AscendingRangeSelect) && (kind != DescendingRangeSelect)) &&
     (kind != SimpleRangeSelect)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RangeSelectSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AscendingRangeSelect:
        case SyntaxKind::DescendingRangeSelect:
        case SyntaxKind::SimpleRangeSelect:
            return true;
        default:
            return false;
    }
}